

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

string * GetSwiftModuleName_abi_cxx11_(string *__return_storage_ptr__,cmGeneratorTarget *target)

{
  string *psVar1;
  string local_70;
  allocator<char> local_39;
  string local_38;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *target_local;
  
  local_18 = target;
  target_local = (cmGeneratorTarget *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Swift_MODULE_NAME",&local_39);
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(local_18);
  std::__cxx11::string::string((string *)&local_70,(string *)psVar1);
  GetTargetPropertyOrDefault(__return_storage_ptr__,target,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetSwiftModuleName(cmGeneratorTarget const* target)
{
  return GetTargetPropertyOrDefault(target, "Swift_MODULE_NAME",
                                    target->GetName());
}